

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O3

UBool __thiscall icu_63::TimeZoneRule::operator==(TimeZoneRule *this,TimeZoneRule *that)

{
  ushort uVar1;
  short sVar2;
  char *__s1;
  char *__s2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if (this == that) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_UObject)._vptr_UObject[-1] + 8);
  __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
  if ((__s1 == __s2) || ((*__s1 != '*' && (iVar4 = strcmp(__s1,__s2), iVar4 == 0)))) {
    uVar1 = (this->fName).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->fName).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      sVar2 = (that->fName).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar5 = (that->fName).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      if (((int)sVar2 & 1U) != 0) {
        return '\0';
      }
      if (iVar4 != iVar5) {
        return '\0';
      }
      UVar3 = UnicodeString::doEquals(&this->fName,&that->fName,iVar4);
      bVar6 = UVar3 != '\0';
    }
    else {
      bVar6 = (bool)(*(byte *)&(that->fName).fUnion & 1);
    }
    if ((bVar6 != false) && (this->fRawOffset == that->fRawOffset)) {
      return this->fDSTSavings == that->fDSTSavings;
    }
  }
  return '\0';
}

Assistant:

UBool
TimeZoneRule::operator==(const TimeZoneRule& that) const {
    return ((this == &that) ||
            (typeid(*this) == typeid(that) &&
            fName == that.fName &&
            fRawOffset == that.fRawOffset &&
            fDSTSavings == that.fDSTSavings));
}